

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_empty_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  size_t sVar1;
  gtoken_s token_00;
  gnode_t *pgVar2;
  gtoken_s token;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  char *local_18;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  gravity_lexer_next(lexer);
  gravity_lexer_token(lexer);
  sVar1 = parser->declarations->n;
  if (sVar1 == 0) {
    pgVar2 = (gnode_t *)0x0;
  }
  else {
    pgVar2 = parser->declarations->p[sVar1 - 1];
  }
  token_00._8_8_ = uStack_30;
  token_00._0_8_ = local_38;
  token_00._16_8_ = local_28;
  token_00._24_8_ = uStack_20;
  token_00.value = local_18;
  pgVar2 = gnode_empty_stat_create(token_00,pgVar2);
  return pgVar2;
}

Assistant:

static gnode_t *parse_empty_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_empty_statement");

    // ;

    DECLARE_LEXER;
    gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    return gnode_empty_stat_create(token, LAST_DECLARATION());
}